

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O1

void __thiscall leveldb::VersionEdit::EncodeTo(VersionEdit *this,string *dst)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  ulong uVar3;
  pointer ppVar4;
  long lVar5;
  Slice local_40;
  
  if (this->has_comparator_ == true) {
    PutVarint32(dst,1);
    local_40.data_ = (this->comparator_)._M_dataplus._M_p;
    local_40.size_ = (this->comparator_)._M_string_length;
    PutLengthPrefixedSlice(dst,&local_40);
  }
  if (this->has_log_number_ == true) {
    PutVarint32(dst,2);
    PutVarint64(dst,this->log_number_);
  }
  if (this->has_prev_log_number_ == true) {
    PutVarint32(dst,9);
    PutVarint64(dst,this->prev_log_number_);
  }
  if (this->has_next_file_number_ == true) {
    PutVarint32(dst,3);
    PutVarint64(dst,this->next_file_number_);
  }
  if (this->has_last_sequence_ == true) {
    PutVarint32(dst,4);
    PutVarint64(dst,this->last_sequence_);
  }
  if ((this->compact_pointers_).
      super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->compact_pointers_).
      super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      PutVarint32(dst,5);
      PutVarint32(dst,*(uint32_t *)
                       ((long)&((this->compact_pointers_).
                                super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar5));
      puVar1 = (undefined8 *)
               ((long)&(((this->compact_pointers_).
                         super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second).rep_._M_dataplus +
               lVar5);
      local_40.data_ = (char *)*puVar1;
      local_40.size_ = puVar1[1];
      PutLengthPrefixedSlice(dst,&local_40);
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar3 < (ulong)(((long)(this->compact_pointers_).
                                    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->compact_pointers_).
                                    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333));
  }
  for (p_Var2 = (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    PutVarint32(dst,6);
    PutVarint32(dst,p_Var2[1]._M_color);
    PutVarint64(dst,(uint64_t)p_Var2[1]._M_parent);
  }
  ppVar4 = (this->new_files_).
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->new_files_).
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      PutVarint32(dst,7);
      PutVarint32(dst,*(uint32_t *)
                       ((long)&((this->new_files_).
                                super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar5));
      PutVarint64(dst,*(uint64_t *)((long)&(ppVar4->second).number + lVar5));
      PutVarint64(dst,*(uint64_t *)((long)&(ppVar4->second).file_size + lVar5));
      puVar1 = (undefined8 *)((long)&(ppVar4->second).smallest.rep_._M_dataplus._M_p + lVar5);
      local_40.data_ = (char *)*puVar1;
      local_40.size_ = puVar1[1];
      PutLengthPrefixedSlice(dst,&local_40);
      puVar1 = (undefined8 *)((long)&(ppVar4->second).largest.rep_._M_dataplus._M_p + lVar5);
      local_40.data_ = (char *)*puVar1;
      local_40.size_ = puVar1[1];
      PutLengthPrefixedSlice(dst,&local_40);
      uVar3 = uVar3 + 1;
      ppVar4 = (this->new_files_).
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x60;
    } while (uVar3 < (ulong)(((long)(this->new_files_).
                                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 5)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void VersionEdit::EncodeTo(std::string* dst) const {
  if (has_comparator_) {
    PutVarint32(dst, kComparator);
    PutLengthPrefixedSlice(dst, comparator_);
  }
  if (has_log_number_) {
    PutVarint32(dst, kLogNumber);
    PutVarint64(dst, log_number_);
  }
  if (has_prev_log_number_) {
    PutVarint32(dst, kPrevLogNumber);
    PutVarint64(dst, prev_log_number_);
  }
  if (has_next_file_number_) {
    PutVarint32(dst, kNextFileNumber);
    PutVarint64(dst, next_file_number_);
  }
  if (has_last_sequence_) {
    PutVarint32(dst, kLastSequence);
    PutVarint64(dst, last_sequence_);
  }

  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    PutVarint32(dst, kCompactPointer);
    PutVarint32(dst, compact_pointers_[i].first);  // level
    PutLengthPrefixedSlice(dst, compact_pointers_[i].second.Encode());
  }

  for (const auto& deleted_file_kvp : deleted_files_) {
    PutVarint32(dst, kDeletedFile);
    PutVarint32(dst, deleted_file_kvp.first);   // level
    PutVarint64(dst, deleted_file_kvp.second);  // file number
  }

  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    PutVarint32(dst, kNewFile);
    PutVarint32(dst, new_files_[i].first);  // level
    PutVarint64(dst, f.number);
    PutVarint64(dst, f.file_size);
    PutLengthPrefixedSlice(dst, f.smallest.Encode());
    PutLengthPrefixedSlice(dst, f.largest.Encode());
  }
}